

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_vfs * sqlite3_vfs_find(char *zVfs)

{
  int iVar1;
  sqlite3_mutex *p;
  int rc;
  sqlite3_mutex *mutex;
  sqlite3_vfs *pVfs;
  char *zVfs_local;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    p = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(p);
    mutex = (sqlite3_mutex *)vfsList;
    while (((mutex != (sqlite3_mutex *)0x0 && (zVfs != (char *)0x0)) &&
           (iVar1 = strcmp(zVfs,(char *)(mutex->mutex).__data.__list.__prev), iVar1 != 0))) {
      mutex = *(sqlite3_mutex **)((long)&mutex->mutex + 0x10);
    }
    sqlite3_mutex_leave(p);
    zVfs_local = (char *)mutex;
  }
  else {
    zVfs_local = (char *)0x0;
  }
  return (sqlite3_vfs *)zVfs_local;
}

Assistant:

SQLITE_API sqlite3_vfs *sqlite3_vfs_find(const char *zVfs){
  sqlite3_vfs *pVfs = 0;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return 0;
#endif
#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  for(pVfs = vfsList; pVfs; pVfs=pVfs->pNext){
    if( zVfs==0 ) break;
    if( strcmp(zVfs, pVfs->zName)==0 ) break;
  }
  sqlite3_mutex_leave(mutex);
  return pVfs;
}